

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::output_adapter(output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this,basic_ostream<char,_std::char_traits<char>_> *s)

{
  shared_ptr<nlohmann::detail::output_stream_adapter<char>_> local_28;
  basic_ostream<char,_std::char_traits<char>_> *local_18;
  basic_ostream<char,_std::char_traits<char>_> *s_local;
  output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_18 = s;
  s_local = (basic_ostream<char,_std::char_traits<char>_> *)this;
  std::make_shared<nlohmann::detail::output_stream_adapter<char>,std::ostream&>
            ((basic_ostream<char,_std::char_traits<char>_> *)&local_28);
  std::shared_ptr<nlohmann::detail::output_adapter_protocol<char>>::
  shared_ptr<nlohmann::detail::output_stream_adapter<char>,void>
            ((shared_ptr<nlohmann::detail::output_adapter_protocol<char>> *)this,&local_28);
  std::shared_ptr<nlohmann::detail::output_stream_adapter<char>_>::~shared_ptr(&local_28);
  return;
}

Assistant:

output_adapter(std::basic_ostream<CharType>& s)
        : oa(std::make_shared<output_stream_adapter<CharType>>(s)) {}